

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O2

filepos_t __thiscall
libmatroska::KaxBlockVirtual::UpdateSize(KaxBlockVirtual *this,bool param_1,bool param_2)

{
  ushort uVar1;
  int16 iVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  byte *pbVar4;
  big_int16 b16;
  undefined8 uStack_28;
  
  uVar1 = this->TrackNumber;
  if (0x3fff < uVar1) {
    __assert_fail("TrackNumber < 0x4000",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                  ,0xf5,"virtual filepos_t libmatroska::KaxBlockVirtual::UpdateSize(bool, bool)");
  }
  pbVar4 = (this->super_EbmlBinary).Data;
  uStack_28 = in_RAX;
  iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])
                    (this,CONCAT71(in_register_00000031,param_1),
                     CONCAT71(in_register_00000011,param_2));
  if (uVar1 < 0x80) {
    if (CONCAT44(extraout_var,iVar3) < 4) {
      __assert_fail("GetSize() >= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0xf9,"virtual filepos_t libmatroska::KaxBlockVirtual::UpdateSize(bool, bool)");
    }
    *pbVar4 = (byte)this->TrackNumber | 0x80;
    pbVar4 = pbVar4 + 1;
  }
  else {
    if (CONCAT44(extraout_var,iVar3) < 5) {
      __assert_fail("GetSize() >= 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0xfc,"virtual filepos_t libmatroska::KaxBlockVirtual::UpdateSize(bool, bool)");
    }
    *pbVar4 = *(byte *)((long)&this->TrackNumber + 1) | 0x40;
    pbVar4[1] = (byte)this->TrackNumber;
    pbVar4 = pbVar4 + 2;
  }
  if (this->ParentCluster != (KaxCluster *)0x0) {
    iVar2 = KaxCluster::GetBlockLocalTimecode(this->ParentCluster,this->Timecode);
    uStack_28._0_6_ = CONCAT24(iVar2,(undefined4)uStack_28);
    libebml::Endian<short,_(libebml::endianess)0>::process_endian
              ((Endian<short,_(libebml::endianess)0> *)((long)&uStack_28 + 4));
    *(undefined2 *)pbVar4 = uStack_28._6_2_;
    pbVar4[2] = 0;
    iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    return CONCAT44(extraout_var_00,iVar3);
  }
  __assert_fail("ParentCluster != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                ,0x101,"virtual filepos_t libmatroska::KaxBlockVirtual::UpdateSize(bool, bool)");
}

Assistant:

filepos_t KaxBlockVirtual::UpdateSize(bool /* bSaveDefault */, bool /* bForceRender */)
{
  assert(TrackNumber < 0x4000);
  binary *cursor = EbmlBinary::GetBuffer();
  // fill data
  if (TrackNumber < 0x80) {
    assert(GetSize() >= 4);
    *cursor++ = TrackNumber | 0x80; // set the first bit to 1
  } else {
    assert(GetSize() >= 5);
    *cursor++ = (TrackNumber >> 8) | 0x40; // set the second bit to 1
    *cursor++ = TrackNumber & 0xFF;
  }

  assert(ParentCluster != NULL);
  int16 ActualTimecode = ParentCluster->GetBlockLocalTimecode(Timecode);
  big_int16 b16(ActualTimecode);
  b16.Fill(cursor);
  cursor += 2;

  *cursor++ = 0; // flags

  return GetSize();
}